

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O2

result<toml::detail::region,_toml::detail::none_t> *
toml::detail::maybe<toml::detail::character<'\''>_>::invoke
          (result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,location *loc)

{
  result<toml::detail::region,_toml::detail::none_t> *ctx;
  result<toml::detail::region,_toml::detail::none_t> rslt;
  result<toml::detail::region,_toml::detail::none_t> local_f8;
  region local_a8;
  region local_60;
  
  ctx = &local_f8;
  character<'\''>::invoke(&local_f8,loc);
  if (local_f8.is_ok_ == true) {
    result<toml::detail::region,_toml::detail::none_t>::result(__return_storage_ptr__,&local_f8);
  }
  else {
    region::region(&local_a8,loc);
    region::region(&local_60,&local_a8);
    ctx = (result<toml::detail::region,_toml::detail::none_t> *)&local_60;
    result<toml::detail::region,_toml::detail::none_t>::result
              (__return_storage_ptr__,(success_type *)&local_60);
    region::~region(&local_60);
    region::~region(&local_a8);
  }
  result<toml::detail::region,_toml::detail::none_t>::cleanup(&local_f8,(EVP_PKEY_CTX *)ctx);
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc)
    {
        const auto rslt = Combinator::invoke(loc);
        if(rslt.is_ok())
        {
            return rslt;
        }
        return ok(region(loc));
    }